

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int url_utf8_validate(void *arg)

{
  int local_30;
  int local_2c;
  int i;
  int nb;
  uint32_t minv;
  uint32_t v;
  uint8_t *s;
  void *arg_local;
  
  _minv = (byte *)arg;
  while( true ) {
    while( true ) {
      if (*_minv == 0) {
        return 0;
      }
      if ((*_minv & 0x80) != 0) break;
      _minv = _minv + 1;
    }
    if ((*_minv & 0xe0) == 0xc0) {
      nb = *_minv & 0x1f;
      i = 0x80;
      local_2c = 1;
    }
    else if ((*_minv & 0xf0) == 0xe0) {
      nb = *_minv & 0xf;
      i = 0x800;
      local_2c = 2;
    }
    else {
      if ((*_minv & 0xf8) != 0xf0) {
        return 3;
      }
      nb = *_minv & 7;
      i = 0x10000;
      local_2c = 3;
    }
    _minv = _minv + 1;
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      if ((*_minv & 0xc0) != 0x80) {
        return 3;
      }
      _minv = _minv + 1;
      nb = (*_minv & 0x3f) + nb * 0x40;
    }
    if ((uint)nb < (uint)i) break;
    if ((0xd7ff < (uint)nb) && ((uint)nb < 0xe000)) {
      return 3;
    }
    if (0x10ffff < (uint)nb) {
      return 3;
    }
  }
  return 3;
}

Assistant:

static int
url_utf8_validate(void *arg)
{
	uint8_t *s = arg;
	uint32_t v, minv;
	int      nb;

	while (*s) {
		if ((s[0] & 0x80u) == 0) {
			s++;
			continue;
		}
		if ((s[0] & 0xe0u) == 0xc0) {
			// 0x80 thru 0x7ff
			v    = (s[0] & 0x1fu);
			minv = 0x80;
			nb   = 1;
		} else if ((s[0] & 0xf0u) == 0xe0) {
			v    = (s[0] & 0xfu);
			minv = 0x800;
			nb   = 2;
		} else if ((s[0] & 0xf8u) == 0xf0) {
			v    = (s[0] & 0x7u);
			minv = 0x10000;
			nb   = 3;
		} else {
			// invalid byte, either continuation, or too many
			// leading 1 bits.
			return (NNG_EINVAL);
		}
		s++;
		for (int i = 0; i < nb; i++) {
			if ((s[0] & 0xc0u) != 0x80) {
				return (NNG_EINVAL); // not continuation
			}
			s++;
			v <<= 6u;
			v += s[0] & 0x3fu;
		}
		if (v < minv) {
			return (NNG_EINVAL);
		}
		if ((v >= 0xd800) && (v <= 0xdfff)) {
			return (NNG_EINVAL);
		}
		if (v > 0x10ffff) {
			return (NNG_EINVAL);
		}
	}
	return (0);
}